

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void co_swap(stCoRoutine_t *curr,stCoRoutine_t *pending_co)

{
  stCoRoutine_t *psVar1;
  stCoRoutineEnv_t *psVar2;
  stCoRoutine_t *update_pending_co;
  stCoRoutine_t *update_occupy_co;
  stCoRoutineEnv_t *curr_env;
  stCoRoutine_t *occupy_co;
  stCoRoutineEnv_t *psStack_20;
  char c;
  stCoRoutineEnv_t *env;
  stCoRoutine_t *pending_co_local;
  stCoRoutine_t *curr_local;
  
  env = (stCoRoutineEnv_t *)pending_co;
  pending_co_local = curr;
  psStack_20 = co_get_curr_thread_env();
  pending_co_local->stack_sp = (char *)((long)&occupy_co + 7);
  if (*(char *)((long)env->pCallStack + 0x9c) == '\0') {
    psStack_20->pending_co = (stCoRoutine_t *)0x0;
    psStack_20->occupy_co = (stCoRoutine_t *)0x0;
  }
  else {
    psStack_20->pending_co = (stCoRoutine_t *)env;
    psVar1 = (stCoRoutine_t *)env->pCallStack[0x15]->env;
    env->pCallStack[0x15]->env = env;
    psStack_20->occupy_co = psVar1;
    if ((psVar1 != (stCoRoutine_t *)0x0) && (psVar1 != (stCoRoutine_t *)env)) {
      save_stack_buffer(psVar1);
    }
  }
  coctx_swap(&pending_co_local->ctx,env->pCallStack + 3);
  psVar2 = co_get_curr_thread_env();
  psVar1 = psVar2->pending_co;
  if ((((psVar2->occupy_co != (stCoRoutine_t *)0x0) && (psVar1 != (stCoRoutine_t *)0x0)) &&
      (psVar2->occupy_co != psVar1)) &&
     ((psVar1->save_buffer != (char *)0x0 && (psVar1->save_size != 0)))) {
    memcpy(psVar1->stack_sp,psVar1->save_buffer,(ulong)psVar1->save_size);
  }
  return;
}

Assistant:

void co_swap(stCoRoutine_t* curr, stCoRoutine_t* pending_co)
{
 	stCoRoutineEnv_t* env = co_get_curr_thread_env();

	//get curr stack sp
	char c;
	curr->stack_sp= &c;

	if (!pending_co->cIsShareStack)
	{
		env->pending_co = NULL;
		env->occupy_co = NULL;
	}
	else 
	{
		env->pending_co = pending_co;
		//get last occupy co on the same stack mem
		stCoRoutine_t* occupy_co = pending_co->stack_mem->occupy_co;
		//set pending co to occupy thest stack mem;
		pending_co->stack_mem->occupy_co = pending_co;

		env->occupy_co = occupy_co;
		if (occupy_co && occupy_co != pending_co)
		{
			save_stack_buffer(occupy_co);
		}
	}

	//swap context
	coctx_swap(&(curr->ctx),&(pending_co->ctx) );

	//stack buffer may be overwrite, so get again;
	stCoRoutineEnv_t* curr_env = co_get_curr_thread_env();
	stCoRoutine_t* update_occupy_co =  curr_env->occupy_co;
	stCoRoutine_t* update_pending_co = curr_env->pending_co;
	
	if (update_occupy_co && update_pending_co && update_occupy_co != update_pending_co)
	{
		//resume stack buffer
		if (update_pending_co->save_buffer && update_pending_co->save_size > 0)
		{
			memcpy(update_pending_co->stack_sp, update_pending_co->save_buffer, update_pending_co->save_size);
		}
	}
}